

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

cmTarget * __thiscall
cmLocalGenerator::LinearGetTargetWithOutput(cmLocalGenerator *this,string *name)

{
  pointer ppcVar1;
  cmTarget *this_00;
  bool bVar2;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar3;
  pointer ppcVar4;
  
  ppcVar4 = (this->Makefile->OrderedTargets).
            super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->Makefile->OrderedTargets).
            super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppcVar4 == ppcVar1) {
      return (cmTarget *)0x0;
    }
    this_00 = *ppcVar4;
    pvVar3 = cmTarget::GetPreBuildCommands(this_00);
    bVar2 = anon_unknown.dwarf_72cb0a::AnyTargetCommandOutputMatches(name,pvVar3);
    if (bVar2) {
      return this_00;
    }
    pvVar3 = cmTarget::GetPreLinkCommands(this_00);
    bVar2 = anon_unknown.dwarf_72cb0a::AnyTargetCommandOutputMatches(name,pvVar3);
    if (bVar2) {
      return this_00;
    }
    pvVar3 = cmTarget::GetPostBuildCommands(this_00);
    bVar2 = anon_unknown.dwarf_72cb0a::AnyTargetCommandOutputMatches(name,pvVar3);
    ppcVar4 = ppcVar4 + 1;
  } while (!bVar2);
  return this_00;
}

Assistant:

cmTarget* cmLocalGenerator::LinearGetTargetWithOutput(
  const std::string& name) const
{
  // We go through the ordered vector of targets to get reproducible results
  // should multiple names match.
  for (cmTarget* t : this->Makefile->GetOrderedTargets()) {
    // Does the output of any command match the source file name?
    if (AnyTargetCommandOutputMatches(name, t->GetPreBuildCommands())) {
      return t;
    }
    if (AnyTargetCommandOutputMatches(name, t->GetPreLinkCommands())) {
      return t;
    }
    if (AnyTargetCommandOutputMatches(name, t->GetPostBuildCommands())) {
      return t;
    }
  }
  return nullptr;
}